

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_data.h
# Opt level: O0

bool ximu::operator==(Quaternion<float> *lhs,Quaternion<float> *rhs)

{
  float fVar1;
  float fVar2;
  undefined1 local_19;
  Quaternion<float> *rhs_local;
  Quaternion<float> *lhs_local;
  
  fVar1 = Quaternion<float>::w(lhs);
  fVar2 = Quaternion<float>::w(rhs);
  local_19 = false;
  if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
    fVar1 = Quaternion<float>::x(lhs);
    fVar2 = Quaternion<float>::x(rhs);
    local_19 = false;
    if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
      fVar1 = Quaternion<float>::y(lhs);
      fVar2 = Quaternion<float>::y(rhs);
      local_19 = false;
      if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
        fVar1 = Quaternion<float>::z(lhs);
        fVar2 = Quaternion<float>::z(rhs);
        local_19 = fVar1 == fVar2;
      }
    }
  }
  return local_19;
}

Assistant:

bool operator==(const Quaternion<T>& lhs, const Quaternion<T> & rhs) {
    return lhs.w() == rhs.w() && lhs.x() == rhs.x() &&
        lhs.y()== rhs.y() && lhs.z() == rhs.z();
  }